

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

int map_set(pMap map,size_t key,void *value)

{
  long lVar1;
  size_t sVar2;
  long lVar3;
  size_t *psVar4;
  void *pvVar5;
  long lVar6;
  
  sVar2 = map->count;
  lVar6 = -1;
  do {
    if (lVar6 - sVar2 == -1) {
      psVar4 = (size_t *)realloc(map->keys,sVar2 * 8 + 8);
      if (psVar4 != (size_t *)0x0) {
        pvVar5 = realloc(map->values,map->value_size * (sVar2 + 1));
        if (pvVar5 != (void *)0x0) {
          psVar4[sVar2] = key;
          memcpy((void *)(sVar2 * map->value_size + (long)pvVar5),value,map->value_size);
          map->count = sVar2 + 1;
          map->keys = psVar4;
          map->values = pvVar5;
          return 0;
        }
      }
      perror("map_set: realloc failed");
      return -1;
    }
    lVar1 = lVar6 + 1;
    lVar3 = lVar6 + 1;
    lVar6 = lVar1;
  } while (map->keys[lVar3] != key);
  memcpy((void *)(lVar1 * map->value_size + (long)map->values),value,map->value_size);
  return 1;
}

Assistant:

int map_set(pMap map, size_t key, void *value)
{
    for (int i = 0; i < map->count; i++)
    {
        if (map->keys[i] == key)
        {
            memcpy(map->values + i * map->value_size, value, map->value_size);
            return MAP_EXISTS;
        }
    }
    size_t index = map->count;
    size_t count = index + 1;
    size_t *keys = realloc(map->keys, count * sizeof(size_t));
    if (keys == NULL)
    {
        perror("map_set: realloc failed");
        return MAP_FAILED;
    }

    void *values = realloc(map->values, count * map->value_size);
    if (values == NULL)
    {
        perror("map_set: realloc failed");
        return MAP_FAILED;
    }
    keys[index] = key;
    memcpy(values + index * map->value_size, value, map->value_size);

    map->count = count;
    map->keys = keys;
    map->values = values;
    return MAP_SUCCESS;
}